

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O0

void * wasm::aligned_malloc(size_t align,size_t size)

{
  void *pvVar1;
  size_t size_local;
  size_t align_local;
  
  pvVar1 = (void *)aligned_alloc(align,size);
  return pvVar1;
}

Assistant:

inline void* aligned_malloc(size_t align, size_t size) {
#if defined(WIN32) || defined(_WIN32)
  _set_errno(0);
  void* ret = _aligned_malloc(size, align);
  if (errno == ENOMEM)
    ret = nullptr;
  return ret;
#elif defined(__APPLE__) || !defined(_ISOC11_SOURCE)
  void* ptr;
  int result = posix_memalign(&ptr, align, size);
  return result == 0 ? ptr : nullptr;
#else
  return aligned_alloc(align, size);
#endif
}